

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hatetarget.cpp
# Opt level: O3

void AHateTarget::InPlaceConstructor(void *mem)

{
  AActor::AActor((AActor *)mem);
  *(undefined ***)mem = &PTR_StaticType_00884d40;
  return;
}

Assistant:

void AHateTarget::BeginPlay()
{
	Super::BeginPlay();
	if (SpawnAngle != 0)
	{	// Each degree translates into 10 units of health
		health = SpawnAngle * 10;
	}
	else
	{
		special2 = 1;
		health = 1000001;
	}
}